

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bandpre.c
# Opt level: O0

int CVBandPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                   void *bp_data)

{
  CVodeMem cv_mem_00;
  int iVar1;
  undefined4 *in_RCX;
  int in_EDX;
  SUNMatrix in_R8;
  SUNLinearSolver in_XMM1_Qa;
  int retval;
  CVodeMem cv_mem;
  CVBandPrecData pdata;
  N_Vector in_stack_00000090;
  N_Vector in_stack_00000098;
  N_Vector in_stack_000000a0;
  undefined4 in_stack_000000a8;
  undefined4 in_stack_000000ac;
  sunrealtype in_stack_000000b0;
  CVBandPrecData in_stack_000000b8;
  SUNMatrix p_Var2;
  int local_4;
  
  cv_mem_00 = (CVodeMem)in_R8[3].content;
  p_Var2 = in_R8;
  if (in_EDX == 0) {
    *in_RCX = 1;
    iVar1 = SUNMatZero(in_R8[1].content);
    if (iVar1 < 0) {
      cvProcessError(cv_mem_00,-1,0x181,"CVBandPrecSetup",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bandpre.c"
                     ,"An error arose from a SUNBandMatrix routine.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
    iVar1 = CVBandPDQJac(in_stack_000000b8,in_stack_000000b0,
                         (N_Vector)CONCAT44(in_stack_000000ac,in_stack_000000a8),in_stack_000000a0,
                         in_stack_00000098,in_stack_00000090);
    if (iVar1 < 0) {
      cvProcessError(cv_mem_00,-1,0x189,"CVBandPrecSetup",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bandpre.c"
                     ,"The right-hand side routine failed in an unrecoverable manner.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
    iVar1 = SUNMatCopy(in_R8[1].content,in_R8[1].ops);
    if (iVar1 < 0) {
      cvProcessError(cv_mem_00,-1,0x192,"CVBandPrecSetup",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bandpre.c"
                     ,"An error arose from a SUNBandMatrix routine.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
  }
  else {
    *in_RCX = 0;
    iVar1 = SUNMatCopy(in_R8[1].content,in_R8[1].ops);
    if (iVar1 < 0) {
      cvProcessError(cv_mem_00,-1,0x175,"CVBandPrecSetup",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bandpre.c"
                     ,"An error arose from a SUNBandMatrix routine.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
  }
  iVar1 = SUNMatScaleAddI((ulong)in_XMM1_Qa ^ 0x8000000000000000,in_R8[1].ops);
  if (iVar1 == 0) {
    local_4 = SUNLinSolSetup_Band(in_XMM1_Qa,p_Var2);
  }
  else {
    cvProcessError(cv_mem_00,-1,0x19c,"CVBandPrecSetup",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bandpre.c"
                   ,"An error arose from a SUNBandMatrix routine.");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int CVBandPrecSetup(sunrealtype t, N_Vector y, N_Vector fy,
                           sunbooleantype jok, sunbooleantype* jcurPtr,
                           sunrealtype gamma, void* bp_data)
{
  CVBandPrecData pdata;
  CVodeMem cv_mem;
  int retval;

  /* Assume matrix and lpivots have already been allocated. */
  pdata  = (CVBandPrecData)bp_data;
  cv_mem = (CVodeMem)pdata->cvode_mem;

  if (jok)
  {
    /* If jok = SUNTRUE, use saved copy of J. */
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }
  else
  {
    /* If jok = SUNFALSE, call CVBandPDQJac for new J value. */
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = CVBandPDQJac(pdata, t, y, fy, pdata->tmp1, pdata->tmp2);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBP_RHSFUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add identity to get savedP = I - gamma*J. */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}